

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arduino-rx-web.cpp
# Opt level: O3

bool GGWave_mainLoop(void)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  time_point tVar9;
  tm *__tp;
  char *pcVar10;
  time_t timestamp;
  TxRxData rxData;
  string tstr;
  allocator local_61;
  time_t local_60;
  undefined8 local_58;
  undefined4 local_50;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  bVar1 = (anonymous_namespace)::g_devIdOut != 0;
  bVar2 = (anonymous_namespace)::g_devIdInp != 0;
  tVar9.__d.__r = GGWave_mainLoop::tLastNoData.__d.__r;
  if (bVar1 || bVar2) {
    cVar3 = GGWave::txHasData();
    if (cVar3 == '\0') {
      SDL_PauseAudioDevice((anonymous_namespace)::g_devIdOut,0);
      if (GGWave_mainLoop()::tLastNoData == '\0') {
        GGWave_mainLoop();
      }
      tVar9.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      iVar5 = SDL_GetQueuedAudioSize((anonymous_namespace)::g_devIdOut);
      iVar6 = GGWave::samplesPerFrame();
      iVar7 = GGWave::sampleSizeOut();
      if (iVar5 < iVar7 * iVar6) {
        SDL_PauseAudioDevice((anonymous_namespace)::g_devIdInp,0);
        iVar5 = SDL_GetQueuedAudioSize((anonymous_namespace)::g_devIdInp);
        iVar6 = GGWave::samplesPerFrame();
        iVar7 = GGWave::sampleSizeInp();
        if (((float)(((long)tVar9.__d.__r - (long)GGWave_mainLoop::tLastNoData.__d.__r) / 1000) /
             1000.0 <= 500.0) || (iVar7 = iVar7 * iVar6, iVar5 < iVar7)) {
          SDL_ClearQueuedAudio((anonymous_namespace)::g_devIdInp);
          tVar9 = GGWave_mainLoop::tLastNoData;
        }
        else {
          if ((GGWave_mainLoop()::dataInp == '\0') &&
             (iVar6 = __cxa_guard_acquire(&GGWave_mainLoop()::dataInp), iVar6 != 0)) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&GGWave_mainLoop::dataInp,(long)iVar7,(allocator_type *)&local_48);
            __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                         &GGWave_mainLoop::dataInp,&__dso_handle);
            __cxa_guard_release(&GGWave_mainLoop()::dataInp);
          }
          SDL_DequeueAudio((anonymous_namespace)::g_devIdInp,
                           GGWave_mainLoop::dataInp.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,iVar7);
          cVar3 = GGWave::decode((anonymous_namespace)::g_ggWave,
                                 (uint)GGWave_mainLoop::dataInp.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
          if (cVar3 == '\0') {
            GGWave_mainLoop();
          }
          else {
            local_58 = 0;
            local_50 = 0;
            iVar6 = GGWave::rxTakeData((anonymous_namespace)::g_ggWave);
            if (0 < iVar6) {
              local_60 = time((time_t *)0x0);
              __tp = localtime(&local_60);
              pcVar10 = asctime(__tp);
              std::__cxx11::string::string((string *)&local_48,pcVar10,&local_61);
              local_48[local_40 + -1] = 0;
              printf("[%s] Received: \'%s\'\n",local_48,local_58);
              if (local_48 != local_38) {
                operator_delete(local_48);
              }
            }
          }
          tVar9.__d.__r = GGWave_mainLoop::tLastNoData.__d.__r;
          if (iVar7 * 0x20 < iVar5) {
            GGWave_mainLoop();
            tVar9 = GGWave_mainLoop::tLastNoData;
          }
        }
      }
    }
    else {
      SDL_PauseAudioDevice((anonymous_namespace)::g_devIdOut,1);
      SDL_PauseAudioDevice((anonymous_namespace)::g_devIdInp,1);
      uVar4 = GGWave::encode();
      iVar5 = (anonymous_namespace)::g_devIdOut;
      uVar8 = GGWave::txWaveform();
      SDL_QueueAudio(iVar5,uVar8,uVar4);
      tVar9 = GGWave_mainLoop::tLastNoData;
    }
  }
  GGWave_mainLoop::tLastNoData.__d.__r = tVar9.__d.__r;
  return bVar1 || bVar2;
}

Assistant:

bool GGWave_mainLoop() {
    if (g_devIdInp == 0 && g_devIdOut == 0) {
        return false;
    }

    if (g_ggWave->txHasData() == false) {
        SDL_PauseAudioDevice(g_devIdOut, SDL_FALSE);

        static auto tLastNoData = std::chrono::high_resolution_clock::now();
        auto tNow = std::chrono::high_resolution_clock::now();

        if ((int) SDL_GetQueuedAudioSize(g_devIdOut) < g_ggWave->samplesPerFrame()*g_ggWave->sampleSizeOut()) {
            SDL_PauseAudioDevice(g_devIdInp, SDL_FALSE);
            const int nHave = (int) SDL_GetQueuedAudioSize(g_devIdInp);
            const int nNeed = g_ggWave->samplesPerFrame()*g_ggWave->sampleSizeInp();
            if (::getTime_ms(tLastNoData, tNow) > 500.0f && nHave >= nNeed) {
                static std::vector<uint8_t> dataInp(nNeed);
                SDL_DequeueAudio(g_devIdInp, dataInp.data(), nNeed);

                if (g_ggWave->decode(dataInp.data(), dataInp.size()) == false) {
                    fprintf(stderr, "Warning: failed to decode input data!\n");
                } else {
                    GGWave::TxRxData rxData;
                    int n = g_ggWave->rxTakeData(rxData);
                    if (n > 0) {
                        std::time_t timestamp = std::time(nullptr);
                        std::string tstr = std::asctime(std::localtime(&timestamp));
                        tstr.back() = 0;
                        printf("[%s] Received: '%s'\n", tstr.c_str(), rxData.data());
                    }
                }

                if (nHave > 32*nNeed) {
                    fprintf(stderr, "Warning: slow processing, clearing queued audio buffer of %d bytes ...", SDL_GetQueuedAudioSize(g_devIdInp));
                    SDL_ClearQueuedAudio(g_devIdInp);
                }
            } else {
                SDL_ClearQueuedAudio(g_devIdInp);
            }
        } else {
            tLastNoData = tNow;
        }
    } else {
        SDL_PauseAudioDevice(g_devIdOut, SDL_TRUE);
        SDL_PauseAudioDevice(g_devIdInp, SDL_TRUE);

        const auto nBytes = g_ggWave->encode();
        SDL_QueueAudio(g_devIdOut, g_ggWave->txWaveform(), nBytes);
    }

    return true;
}